

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lex.cpp
# Opt level: O0

Token * __thiscall EOPlus::Lexer::ReadOperator(Token *__return_storage_ptr__,Lexer *this)

{
  bool bVar1;
  variant local_170;
  variant local_130;
  variant local_f0;
  function<bool_(char)> local_b0;
  variant local_90;
  function<bool_(char)> local_40;
  char local_1a;
  char local_19;
  char cc;
  Lexer *pLStack_18;
  char c;
  Lexer *this_local;
  
  local_19 = '\0';
  local_1a = '\0';
  pLStack_18 = this;
  this_local = (Lexer *)__return_storage_ptr__;
  std::function<bool(char)>::function<bool(&)(char),void>
            ((function<bool(char)> *)&local_40,ctype_op);
  bVar1 = GetCharIf(this,&local_19,&local_40);
  std::function<bool_(char)>::~function(&local_40);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    PeekChar(this,&local_1a);
    bVar1 = check_op(local_19,local_1a);
    if (bVar1) {
      std::function<bool(char)>::function<bool(&)(char),void>
                ((function<bool(char)> *)&local_b0,ctype_op);
      GetCharIf(this,&local_1a,&local_b0);
      std::function<bool_(char)>::~function(&local_b0);
    }
    bVar1 = check_op(local_19,local_1a);
    if (bVar1) {
      util::variant::variant(&local_f0,(uint)(byte)(local_19 + -0x20 + local_1a * '\x04'));
      Token::Token(__return_storage_ptr__,Operator,&local_f0);
      util::variant::~variant(&local_f0);
    }
    else {
      bVar1 = check_op(local_19,'\0');
      if (bVar1) {
        util::variant::variant(&local_130,(uint)(byte)(local_19 - 0x20));
        Token::Token(__return_storage_ptr__,Operator,&local_130);
        util::variant::~variant(&local_130);
      }
      else {
        util::variant::variant(&local_170);
        Token::Token(__return_storage_ptr__,Invalid,&local_170);
        util::variant::~variant(&local_170);
      }
    }
  }
  else {
    util::variant::variant(&local_90);
    Token::Token(__return_storage_ptr__,Invalid,&local_90);
    util::variant::~variant(&local_90);
  }
  return __return_storage_ptr__;
}

Assistant:

Token Lexer::ReadOperator()
	{
		char c = '\0';
		char cc = '\0';

		if (!this->GetCharIf(c, ctype_op))
			return Token();

		this->PeekChar(cc);

		if (check_op(c, cc))
			this->GetCharIf(cc, ctype_op);

		if (check_op(c, cc))
			return Token(Token::Operator, UOP2(c, cc));
		else if (check_op(c, '\0'))
			return Token(Token::Operator, UOP2(c, '\0'));
		else
			return Token();
	}